

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O2

void ntru_encode_pubkey(uint16_t *pubkey,uint p,uint q,BinarySink *bs)

{
  uint16_t *out;
  NTRUEncodeSchedule *sched;
  
  out = (uint16_t *)safemalloc((ulong)p,2,0);
  ntru_bias(out,pubkey,q >> 1,p,q);
  sched = ntru_encode_pubkey_schedule(p,q);
  ntru_encode(sched,out,bs);
  ntru_encode_schedule_free(sched);
  ring_free(out,p);
  return;
}

Assistant:

void ntru_encode_pubkey(const uint16_t *pubkey, unsigned p, unsigned q,
                        BinarySink *bs)
{
    /* Compute the biased version for encoding */
    uint16_t *biased_pubkey = snewn(p, uint16_t);
    ntru_bias(biased_pubkey, pubkey, q / 2, p, q);

    /* Encode it */
    NTRUEncodeSchedule *sched = ntru_encode_pubkey_schedule(p, q);
    ntru_encode(sched, biased_pubkey, bs);
    ntru_encode_schedule_free(sched);

    ring_free(biased_pubkey, p);
}